

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_subqueryref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind
          (Binder *this,SubqueryRef *ref,optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte)

{
  pointer __val;
  int iVar1;
  Binder *pBVar2;
  pointer pSVar3;
  pointer pBVar4;
  undefined4 extraout_var;
  pointer pBVar5;
  type subquery;
  type other;
  long in_RCX;
  shared_ptr<duckdb::Binder,_true> binder;
  string subquery_alias;
  allocator local_91;
  undefined1 local_90 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  string local_78;
  string local_58;
  optional_ptr<duckdb::CommonTableExpressionInfo,_true> local_38;
  
  CreateBinder((Binder *)(local_90 + 8),
               (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  pBVar2->can_contain_nulls = true;
  if (in_RCX != 0) {
    pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
    local_78._M_dataplus._M_p =
         (pointer)optional_ptr<duckdb::CommonTableExpressionInfo,_true>::operator*(&local_38);
    ::std::__detail::
    _Insert<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,_duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,_duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&pBVar2->bound_ctes,(value_type *)&local_78);
  }
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&cte.ptr[1].key_targets.
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            (&pSVar3->node);
  BindNode((Binder *)local_90,(QueryNode *)pBVar2);
  if (((cte.ptr)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    ::std::__cxx11::string::string((string *)&local_78,"unnamed_subquery",&local_91);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_78,
               (string *)
               &((cte.ptr)->aliases).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  ::std::__cxx11::string::operator=((string *)&pBVar2->alias,(string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)local_90);
  iVar1 = (*pBVar4->_vptr_BoundQueryNode[2])(pBVar4);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (((cte.ptr)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    __val = ref[7].super_TableRef.alias._M_dataplus._M_p;
    ref[7].super_TableRef.alias._M_dataplus._M_p = __val + 1;
    ::std::__cxx11::string::assign((char *)&local_78);
    if ((pointer)0x1 < __val) {
      ::std::__cxx11::to_string(&local_58,(unsigned_long)__val);
      ::std::__cxx11::string::append((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&local_78);
  }
  make_uniq<duckdb::BoundSubqueryRef,duckdb::shared_ptr<duckdb::Binder,true>,duckdb::unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>,true>>
            ((duckdb *)&local_58,(shared_ptr<duckdb::Binder,_true> *)(local_90 + 8),
             (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)local_90);
  pBVar5 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                         *)&local_58);
  subquery = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar5->subquery);
  BindContext::AddSubquery
            ((BindContext *)&ref[1].super_TableRef.alias._M_string_length,
             CONCAT44(extraout_var,iVar1),&local_78,(SubqueryRef *)cte.ptr,subquery);
  pBVar5 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                         *)&local_58);
  other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar5->binder);
  MoveCorrelatedExpressions((Binder *)ref,other);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._M_dataplus._M_p;
  ::std::__cxx11::string::~string((string *)&local_78);
  if ((_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
      local_90._0_8_ != (BoundQueryNode *)0x0) {
    (**(code **)(*(long *)local_90._0_8_ + 8))();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(SubqueryRef &ref, optional_ptr<CommonTableExpressionInfo> cte) {
	auto binder = Binder::CreateBinder(context, this);
	binder->can_contain_nulls = true;
	if (cte) {
		binder->bound_ctes.insert(*cte);
	}
	auto subquery = binder->BindNode(*ref.subquery->node);
	binder->alias = ref.alias.empty() ? "unnamed_subquery" : ref.alias;
	idx_t bind_index = subquery->GetRootIndex();
	string subquery_alias;
	if (ref.alias.empty()) {
		auto index = unnamed_subquery_index++;
		subquery_alias = "unnamed_subquery";
		;
		if (index > 1) {
			subquery_alias += to_string(index);
		}
	} else {
		subquery_alias = ref.alias;
	}
	auto result = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(subquery));
	bind_context.AddSubquery(bind_index, subquery_alias, ref, *result->subquery);
	MoveCorrelatedExpressions(*result->binder);
	return std::move(result);
}